

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

int exception_target_el(CPUARMState_conflict *env)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  uVar2 = arm_current_el(env);
  iVar4 = uVar2 + (uVar2 == 0);
  _Var1 = arm_is_secure(env);
  if (_Var1) {
    iVar3 = 3;
    if (1 < uVar2) {
      iVar3 = iVar4;
    }
    if ((env->features & 0x10000000) == 0) {
      iVar4 = iVar3;
    }
  }
  return iVar4;
}

Assistant:

static inline int exception_target_el(CPUARMState *env)
{
    int target_el = MAX(1, arm_current_el(env));

    /*
     * No such thing as secure EL1 if EL3 is aarch32,
     * so update the target EL to EL3 in this case.
     */
    if (arm_is_secure(env) && !arm_el_is_aa64(env, 3) && target_el == 1) {
        target_el = 3;
    }

    return target_el;
}